

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkUnsignedByteText_Test::testBody
          (TEST_TestHarness_c_checkUnsignedByteText_Test *this)

{
  TestTestingFixture *pTVar1;
  byte bVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_TestHarness_c_checkUnsignedByteText_Test *local_10;
  TEST_TestHarness_c_checkUnsignedByteText_Test *this_local;
  
  local_10 = this;
  CHECK_EQUAL_C_UBYTE_LOCATION
            (0xfe,0xfe,"Text",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x1d8);
  TestTestingFixture::setTestFunction
            ((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture,failUnsignedByteTextMethod_
            );
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_20,"expected <254>\n\tbut was  <253>");
  TestTestingFixture::assertPrintContains(pTVar1,&local_20);
  SimpleString::~SimpleString(&local_20);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(local_40,"arness_c");
  TestTestingFixture::assertPrintContains(pTVar1,local_40);
  SimpleString::~SimpleString(local_40);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_50,"Message: UnsignedByteTestText");
  TestTestingFixture::assertPrintContains(pTVar1,&local_50);
  SimpleString::~SimpleString(&local_50);
  pUVar3 = UtestShell::getCurrent();
  bVar2 = hasDestructorOfTheDestructorCheckedBeenCalled ^ 0xff;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(bVar2 & 1),"CHECK","!hasDestructorOfTheDestructorCheckedBeenCalled",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x1de,pTVar4);
  return;
}

Assistant:

TEST(TestHarness_c, checkUnsignedByteText)
{
    CHECK_EQUAL_C_UBYTE_TEXT(254, 254, "Text");
    fixture->setTestFunction(failUnsignedByteTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <254>\n\tbut was  <253>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: UnsignedByteTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}